

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

TestFactoryBase * __thiscall
testing::internal::TestMetaFactory<RenderTest_RadianceMatches_Test>::CreateTestFactory
          (TestMetaFactory<RenderTest_RadianceMatches_Test> *this,ParamType *parameter)

{
  ParameterizedTestFactory<RenderTest_RadianceMatches_Test> *this_00;
  TestIntegrator TStack_88;
  
  this_00 = (ParameterizedTestFactory<RenderTest_RadianceMatches_Test> *)operator_new(0x80);
  TestIntegrator::TestIntegrator(&TStack_88,parameter);
  ParameterizedTestFactory<RenderTest_RadianceMatches_Test>::ParameterizedTestFactory
            (this_00,&TStack_88);
  TestIntegrator::~TestIntegrator(&TStack_88);
  return &this_00->super_TestFactoryBase;
}

Assistant:

virtual TestFactoryBase* CreateTestFactory(ParamType parameter) {
    return new ParameterizedTestFactory<TestCase>(parameter);
  }